

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::selectFile(QFileDialog *this,QString *filename)

{
  QFileDialogPrivate *this_00;
  QFileDialogLineEdit *this_01;
  QFileDialogOptions *pQVar1;
  QUrl QVar2;
  char cVar3;
  bool bVar4;
  QItemSelectionModel *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QFileInfo info;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QUrl url;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((filename->d).size != 0) {
    this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
    if (((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
       ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
      cVar3 = QDir::isRelativePath((QString *)filename);
      if (cVar3 == '\0') {
        _info = (anon_union_24_3_e3d07ef4_for_data *)&DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo(&info,(QString *)filename);
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::absoluteDir();
        QDir::path();
        QDir::~QDir((QDir *)&local_78);
        QFileSystemModel::rootPath();
        bVar4 = ::operator!=((QString *)&local_78,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        if (bVar4) {
          setDirectory(this,(QString *)&local_58);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        QFileInfo::~QFileInfo(&info);
      }
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemModel::index((QString *)&local_78,(int)this_00->model);
      pQVar5 = QAbstractItemView::selectionModel
                         ((QAbstractItemView *)((this_00->qFileDialogUi).d)->listView);
      (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5);
      if ((((this->super_QDialog).super_QWidget.data)->widget_attributes & 0x8000) != 0) {
        bVar4 = QWidget::hasFocus((QWidget *)((this_00->qFileDialogUi).d)->fileNameEdit);
        if (bVar4) goto LAB_00496813;
      }
      this_01 = ((this_00->qFileDialogUi).d)->fileNameEdit;
      if ((((int)local_78 < 0) || ((long)local_78 < 0)) ||
         (local_68.ptr == (QAbstractItemModel *)0x0)) {
        QFileDialogPrivate::rootPath((QString *)&local_58,this_00);
        local_b8.d = (filename->d).d;
        local_b8.ptr = (filename->d).ptr;
        local_b8.size = (filename->d).size;
        if ((anon_union_24_3_e3d07ef4_for_data *)local_b8.d !=
            (anon_union_24_3_e3d07ef4_for_data *)0x0) {
          LOCK();
          *(int *)local_b8.d = *(int *)local_b8.d + 1;
          UNLOCK();
        }
        QFileInfo::QFileInfo(&info,(QString *)&local_b8);
        bVar4 = QFileInfo::isAbsolute(&info);
        QFileInfo::~QFileInfo(&info);
        if (bVar4) {
          cVar3 = QString::startsWith((QString *)&local_b8,(CaseSensitivity)&local_58);
          if (cVar3 != '\0') {
            QString::remove((longlong)&local_b8,0);
          }
          if ((local_b8.size != 0) && (*local_b8.ptr == L'/')) {
            QString::remove((longlong)&local_b8,0);
          }
        }
        _info = (anon_union_24_3_e3d07ef4_for_data *)local_b8.d;
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (char16_t *)0x0;
        local_b8.size = 0;
        QLineEdit::setText(&this_01->super_QLineEdit,(QString *)&info);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
      else {
        QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_78,0);
        ::QVariant::toString();
        QLineEdit::setText(&this_01->super_QLineEdit,(QString *)&info);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
    }
    else {
      url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::QUrl(&url);
      QFileInfo::QFileInfo((QFileInfo *)local_58.data,(QString *)filename);
      cVar3 = QFileInfo::isRelative();
      QFileInfo::~QFileInfo((QFileInfo *)local_58.data);
      if (cVar3 == '\0') {
        QUrl::fromLocalFile((QString *)local_58.data);
        QVar2 = url;
        url.d = (QUrlPrivate *)local_58.shared;
        local_58.shared = (PrivateShared *)QVar2.d;
        QUrl::~QUrl((QUrl *)&local_58.shared);
      }
      else {
        QFileDialogOptions::initialDirectory();
        QVar2 = url;
        url.d = (QUrlPrivate *)local_58.shared;
        local_58.shared = (PrivateShared *)QVar2.d;
        QUrl::~QUrl((QUrl *)&local_58.shared);
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QUrl::path(&local_58,&url,0x7f00000);
        cVar3 = QString::endsWith((QChar)(char16_t)&local_58,0x2f);
        if (cVar3 == '\0') {
          QString::append((QChar)(char16_t)&local_58);
        }
        _info = &local_58;
        QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                  ((QString *)&local_78,(QStringBuilder<QString_&,_const_QString_&> *)&info);
        QUrl::setPath((QString *)&url,(ParsingMode)(QArrayDataPointer<char16_t> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
      QFileDialogPrivate::selectFile_sys(this_00,&url);
      pQVar1 = (this_00->options).value.ptr;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (undefined1 *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      QList<QUrl>::emplaceBack<QUrl_const&>((QList<QUrl> *)&local_58,&url);
      QFileDialogOptions::setInitiallySelectedFiles((QList_conflict *)pQVar1);
      QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
      QUrl::~QUrl(&url);
    }
  }
LAB_00496813:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::selectFile(const QString &filename)
{
    Q_D(QFileDialog);
    if (filename.isEmpty())
        return;

    if (!d->usingWidgets()) {
        QUrl url;
        if (QFileInfo(filename).isRelative()) {
            url = d->options->initialDirectory();
            QString path = url.path();
            if (!path.endsWith(u'/'))
                path += u'/';
            url.setPath(path + filename);
        } else {
            url = QUrl::fromLocalFile(filename);
        }
        d->selectFile_sys(url);
        d->options->setInitiallySelectedFiles(QList<QUrl>() << url);
        return;
    }

    if (!QDir::isRelativePath(filename)) {
        QFileInfo info(filename);
        QString filenamePath = info.absoluteDir().path();

        if (d->model->rootPath() != filenamePath)
            setDirectory(filenamePath);
    }

    QModelIndex index = d->model->index(filename);
    d->qFileDialogUi->listView->selectionModel()->clear();
    if (!isVisible() || !d->lineEdit()->hasFocus())
        d->lineEdit()->setText(index.isValid() ? index.data().toString() : fileFromPath(d->rootPath(), filename));
}